

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::crn_comp(crn_comp *this)

{
  vector<unsigned_char> *local_170;
  static_huffman_data_model *local_150;
  symbol_histogram *local_130;
  vector<unsigned_short> *local_110;
  static_huffman_data_model *local_f0;
  symbol_histogram *local_d0;
  vector<unsigned_short> *local_b0;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_38;
  crn_comp *this_local;
  
  itexture_comp::itexture_comp(&this->super_itexture_comp);
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__crn_comp_00269858;
  task_pool::task_pool(&this->m_task_pool);
  this->m_pParams = (crn_comp_params *)0x0;
  local_38 = this->m_images[0];
  do {
    image<crnlib::color_quad<unsigned_char,_int>_>::image(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (image<crnlib::color_quad<unsigned_char,_int>_> *)this->m_has_comp);
  vector<crnlib::crn_comp::level_details>::vector(&this->m_levels);
  vector<unsigned_int>::vector(&this->m_color_endpoints);
  vector<unsigned_int>::vector(&this->m_alpha_endpoints);
  vector<unsigned_int>::vector(&this->m_color_selectors);
  vector<unsigned_long_long>::vector(&this->m_alpha_selectors);
  vector<crnlib::dxt_hc::endpoint_indices_details>::vector(&this->m_endpoint_indices);
  vector<crnlib::dxt_hc::selector_indices_details>::vector(&this->m_selector_indices);
  crnd::crn_header::crn_header(&this->m_crn_header);
  vector<unsigned_char>::vector(&this->m_comp_data);
  dxt_hc::dxt_hc(&this->m_hvq);
  symbol_histogram::symbol_histogram(&this->m_reference_hist,0);
  static_huffman_data_model::static_huffman_data_model(&this->m_reference_dm);
  local_b0 = this->m_endpoint_remaping;
  do {
    vector<unsigned_short>::vector(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (vector<unsigned_short> *)this->m_endpoint_index_hist);
  local_d0 = this->m_endpoint_index_hist;
  do {
    symbol_histogram::symbol_histogram(local_d0,0);
    local_d0 = local_d0 + 1;
  } while (local_d0 != (symbol_histogram *)&this->field_0x1f10);
  local_f0 = (static_huffman_data_model *)&this->field_0x1f10;
  do {
    static_huffman_data_model::static_huffman_data_model(local_f0);
    local_f0 = local_f0 + 1;
  } while (local_f0 != (static_huffman_data_model *)this->m_selector_remaping);
  local_110 = this->m_selector_remaping;
  do {
    vector<unsigned_short>::vector(local_110);
    local_110 = local_110 + 1;
  } while (local_110 != (vector<unsigned_short> *)this->m_selector_index_hist);
  local_130 = this->m_selector_index_hist;
  do {
    symbol_histogram::symbol_histogram(local_130,0);
    local_130 = local_130 + 1;
  } while (local_130 != (symbol_histogram *)&this->field_0x1fc0);
  local_150 = (static_huffman_data_model *)&this->field_0x1fc0;
  do {
    static_huffman_data_model::static_huffman_data_model(local_150);
    local_150 = local_150 + 1;
  } while (local_150 != (static_huffman_data_model *)this->m_packed_blocks);
  local_170 = this->m_packed_blocks;
  do {
    vector<unsigned_char>::vector(local_170);
    local_170 = local_170 + 1;
  } while (local_170 != &this->m_packed_data_models);
  vector<unsigned_char>::vector(&this->m_packed_data_models);
  vector<unsigned_char>::vector(&this->m_packed_color_endpoints);
  vector<unsigned_char>::vector(&this->m_packed_color_selectors);
  vector<unsigned_char>::vector(&this->m_packed_alpha_endpoints);
  vector<unsigned_char>::vector(&this->m_packed_alpha_selectors);
  return;
}

Assistant:

crn_comp::crn_comp() :
        m_pParams(nullptr)
    {
    }